

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int raviX_bitset_intersect_p(BitSet *bm1,BitSet *bm2)

{
  ulong local_58;
  bitset_el_t *addr2;
  bitset_el_t *addr1;
  size_t bm2_len;
  size_t bm1_len;
  size_t min_len;
  size_t i;
  BitSet *bm2_local;
  BitSet *bm1_local;
  
  local_58 = bm2->els_num;
  if (bm1->els_num <= local_58) {
    local_58 = bm1->els_num;
  }
  min_len = 0;
  while( true ) {
    if (local_58 <= min_len) {
      return 0;
    }
    if ((bm1->varr[min_len] & bm2->varr[min_len]) != 0) break;
    min_len = min_len + 1;
  }
  return 1;
}

Assistant:

int raviX_bitset_intersect_p(const BitSet * bm1, const BitSet * bm2) {
	size_t i, min_len, bm1_len = bm1->els_num;
	size_t bm2_len = bm2->els_num;
	bitset_el_t *addr1 = bm1->varr;
	bitset_el_t *addr2 = bm2->varr;

	min_len = bm1_len <= bm2_len ? bm1_len : bm2_len;
	for (i = 0; i < min_len; i++)
		if ((addr1[i] & addr2[i]) != 0) return true;
	return false;
}